

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqltablemodel.cpp
# Opt level: O2

void __thiscall QSqlTableModel::revertAll(QSqlTableModel *this)

{
  int iVar1;
  uint uVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<int> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
  QMap<int,_QSqlTableModelPrivate::ModifiedRow>::keys
            ((QList<int> *)&local_38,
             (QMap<int,_QSqlTableModelPrivate::ModifiedRow> *)
             (*(long *)&(this->super_QSqlQueryModel).field_0x8 + 0x2e0));
  uVar2 = (uint)local_38.size;
  while( true ) {
    uVar2 = uVar2 - 1;
    if ((int)uVar2 < 0) break;
    iVar1 = 0;
    if ((undefined1 *)(ulong)(uVar2 & 0x7fffffff) < (ulong)local_38.size) {
      iVar1 = local_38.ptr[(long)(ulong)(uVar2 & 0x7fffffff)];
    }
    (**(code **)(*(long *)&this->super_QSqlQueryModel + 0x1c0))(this,iVar1);
  }
  QArrayDataPointer<int>::~QArrayDataPointer(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSqlTableModel::revertAll()
{
    Q_D(QSqlTableModel);

    const QList<int> rows(d->cache.keys());
    for (int i = rows.size() - 1; i >= 0; --i)
        revertRow(rows.value(i));
}